

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

void D_CheckNetGame(void)

{
  SWORD SVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char filename [20];
  char acStack_38 [24];
  
  nodeingame[0] = false;
  nodeingame[1] = false;
  nodeingame[2] = false;
  nodeingame[3] = false;
  nodeingame[4] = false;
  nodeingame[5] = false;
  nodeingame[6] = false;
  nodeingame[7] = false;
  nettics[0] = 0;
  nettics[1] = 0;
  nettics[2] = 0;
  nettics[3] = 0;
  nettics[4] = 0;
  nettics[5] = 0;
  nettics[6] = 0;
  nettics[7] = 0;
  remoteresend[0] = false;
  remoteresend[1] = false;
  remoteresend[2] = false;
  remoteresend[3] = false;
  remoteresend[4] = false;
  remoteresend[5] = false;
  remoteresend[6] = false;
  remoteresend[7] = false;
  resendto[0] = 0;
  resendto[1] = 0;
  resendto[2] = 0;
  resendto[3] = 0;
  resendto[4] = 0;
  resendto[5] = 0;
  resendto[6] = 0;
  resendto[7] = 0;
  pcVar3 = DArgs::CheckValue(Args,"-netmode");
  if (pcVar3 != (char *)0x0) {
    iVar2 = atoi(pcVar3);
    if (iVar2 != 0) {
      Printf(
            "\x1cKNotice: Using PacketServer (netmode 1) over the internet is prone to running too slow on some internet configurations.\nIf the game is running well below expected speeds, use netmode 0 (P2P) instead.\n"
            );
    }
  }
  I_InitNetwork();
  if (doomcom.id != 0x12345678) {
    I_FatalError("Doomcom buffer invalid!");
  }
  DAT_017e1fd1 = 1;
  consoleplayer = (int)doomcom.consoleplayer;
  if (Net_Arbitrator == consoleplayer) {
    pcVar3 = DArgs::CheckValue(Args,"-netmode");
    if (pcVar3 != (char *)0x0) {
      iVar2 = atoi(pcVar3);
      NetMode = iVar2 != 0;
    }
    if (1 < doomcom.numnodes) {
      pcVar5 = "packet server";
      if (NetMode == '\0') {
        pcVar5 = "peer to peer";
      }
      pcVar4 = "forced";
      if (pcVar3 == (char *)0x0) {
        pcVar4 = "auto";
      }
      Printf("Selected \x1cH%s\x1c- networking mode. (%s)\n",pcVar5,pcVar4);
    }
    iVar2 = DArgs::CheckParm(Args,"-extratic",1);
    if (iVar2 != 0) {
      FBaseCVar::SetGenericRep(&net_extratic.super_FBaseCVar,(UCVarValue)0x1,CVAR_Int);
    }
  }
  D_SetupUserInfo();
  iVar2 = DArgs::CheckParm(Args,"-debugfile",1);
  if (iVar2 != 0) {
    mysnprintf(acStack_38,0x14,"debug%i.txt",(ulong)(uint)consoleplayer);
    Printf("debug output to: %s\n",acStack_38);
    debugfile = (FILE *)fopen(acStack_38,"w");
  }
  if (netgame == true) {
    FGameConfigFile::ReadNetVars(GameConfig);
    D_ArbitrateNetStart();
  }
  ticdup = (int)doomcom.ticdup;
  if (0 < (long)doomcom.numplayers) {
    memset(playeringame,1,(long)doomcom.numplayers);
  }
  SVar1 = doomcom.numnodes;
  if (0 < (long)doomcom.numnodes) {
    memset(nodeingame,1,(long)doomcom.numnodes);
    if ((SVar1 != 1) && (consoleplayer != Net_Arbitrator)) {
      pcVar3 = "packet server";
      if (NetMode == '\0') {
        pcVar3 = "peer to peer";
      }
      Printf("Arbitrator selected \x1cH%s\x1c- networking mode.\n",pcVar3);
    }
  }
  if (batchrun == false) {
    Printf("player %i of %i (%i nodes)\n",(ulong)(consoleplayer + 1),
           (ulong)(uint)(int)doomcom.numplayers,(ulong)(uint)(int)doomcom.numnodes);
  }
  return;
}

Assistant:

void D_CheckNetGame (void)
{
	const char *v;
	int i;

	for (i = 0; i < MAXNETNODES; i++)
	{
		nodeingame[i] = false;
		nettics[i] = 0;
		remoteresend[i] = false;		// set when local needs tics
		resendto[i] = 0;				// which tic to start sending
	}

	// Packet server has proven to be rather slow over the internet. Print a warning about it.
	v = Args->CheckValue("-netmode");
	if (v != NULL && (atoi(v) != 0))
	{
		Printf(TEXTCOLOR_YELLOW "Notice: Using PacketServer (netmode 1) over the internet is prone to running too slow on some internet configurations."
			"\nIf the game is running well below expected speeds, use netmode 0 (P2P) instead.\n");
	}

	// I_InitNetwork sets doomcom and netgame
	if (I_InitNetwork ())
	{
		// For now, stop auto selecting PacketServer, as it's more likely to cause confusion.
		//NetMode = NET_PacketServer;
	}
	if (doomcom.id != DOOMCOM_ID)
	{
		I_FatalError ("Doomcom buffer invalid!");
	}
	players[0].settings_controller = true;

	consoleplayer = doomcom.consoleplayer;

	if (consoleplayer == Net_Arbitrator)
	{
		v = Args->CheckValue("-netmode");
		if (v != NULL)
		{
			NetMode = atoi(v) != 0 ? NET_PacketServer : NET_PeerToPeer;
		}
		if (doomcom.numnodes > 1)
		{
			Printf("Selected " TEXTCOLOR_BLUE "%s" TEXTCOLOR_NORMAL " networking mode. (%s)\n", NetMode == NET_PeerToPeer ? "peer to peer" : "packet server",
				v != NULL ? "forced" : "auto");
		}

		if (Args->CheckParm("-extratic"))
		{
			net_extratic = 1;
		}
	}

	// [RH] Setup user info
	D_SetupUserInfo ();

	if (Args->CheckParm ("-debugfile"))
	{
		char filename[20];
		mysnprintf (filename, countof(filename), "debug%i.txt", consoleplayer);
		Printf ("debug output to: %s\n", filename);
		debugfile = fopen (filename, "w");
	}

	if (netgame)
	{
		GameConfig->ReadNetVars ();	// [RH] Read network ServerInfo cvars
		D_ArbitrateNetStart ();
	}

	// read values out of doomcom
	ticdup = doomcom.ticdup;

	for (i = 0; i < doomcom.numplayers; i++)
		playeringame[i] = true;
	for (i = 0; i < doomcom.numnodes; i++)
		nodeingame[i] = true;

	if (consoleplayer != Net_Arbitrator && doomcom.numnodes > 1)
	{
		Printf("Arbitrator selected " TEXTCOLOR_BLUE "%s" TEXTCOLOR_NORMAL " networking mode.\n", NetMode == NET_PeerToPeer ? "peer to peer" : "packet server");
	}

	if (!batchrun) Printf ("player %i of %i (%i nodes)\n",
			consoleplayer+1, doomcom.numplayers, doomcom.numnodes);
}